

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_mixw(char *fn)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  double local_50;
  float64 sum;
  int32 normalize;
  uint32 k;
  uint32 j;
  uint32 p_i;
  uint32 i;
  uint32 n_density;
  uint32 n_feat;
  uint32 mixw_e;
  uint32 mixw_s;
  uint32 n_mixw;
  float32 ***mixw;
  char *fn_local;
  
  n_feat = 0xffffffff;
  n_density = 0xffffffff;
  mixw = (float32 ***)fn;
  pcVar2 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar2,"-norm");
  pcVar5 = ".";
  if ((int)lVar3 != 0) {
    pcVar5 = "and normalizing.";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x1a5,"Reading %s%s\n",mixw,pcVar5);
  pcVar2 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar2,"-mixws");
  if (pcVar5 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar2,"-mixws");
    n_feat = (uint32)lVar4;
  }
  pcVar2 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar2,"-mixwe");
  if (pcVar5 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar2,"-mixwe");
    n_density = (uint32)lVar4;
  }
  if ((n_feat == 0xffffffff) && (n_density == 0xffffffff)) {
    iVar1 = s3mixw_read((char *)mixw,(float32 ****)&mixw_s,&mixw_e,&i,&p_i);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u\n",(ulong)mixw_e,(ulong)i,(ulong)p_i);
  }
  else {
    iVar1 = s3mixw_intv_read((char *)mixw,n_feat,n_density,(float32 ****)&mixw_s,&mixw_e,&i,&p_i);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u subinterval [%u %u]\n",(ulong)mixw_e,(ulong)i,(ulong)p_i,(ulong)n_feat,
           (ulong)n_density);
  }
  for (j = 0; j < mixw_e; j = j + 1) {
    if (n_feat == 0xffffffff) {
      k = j;
    }
    else {
      k = j + n_feat;
    }
    for (normalize = 0; (uint)normalize < i; normalize = normalize + 1) {
      local_50 = 0.0;
      for (sum._4_4_ = 0; sum._4_4_ < p_i; sum._4_4_ = sum._4_4_ + 1) {
        local_50 = (double)(float)_mixw_s[j][(uint)normalize][sum._4_4_] + local_50;
      }
      printf("mixw [%u %u] %e\n",local_50,(ulong)k,(ulong)(uint)normalize);
      if ((int)lVar3 == 0) {
        local_50 = 1.0;
      }
      else if ((local_50 == 0.0) && (!NAN(local_50))) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                ,0x1d5,"mixw [%u][%u][*] zero\n",(ulong)k,(ulong)(uint)normalize);
        local_50 = 1.0;
      }
      for (sum._4_4_ = 0; sum._4_4_ < p_i; sum._4_4_ = sum._4_4_ + 1) {
        if ((sum._4_4_ & 7) == 0) {
          printf("\n\t");
        }
        printf(e_fmt,(double)(float)_mixw_s[j][(uint)normalize][sum._4_4_] / local_50);
      }
      printf("\n");
    }
  }
  return 0;
}

Assistant:

int
print_mixw(const char *fn)
{
    float32 ***mixw;
    uint32 n_mixw;
    uint32 mixw_s = NO_ID;
    uint32 mixw_e = NO_ID;
    uint32 n_feat;
    uint32 n_density;
    uint32 i, p_i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float64 sum;

    E_INFO("Reading %s%s\n",
	   fn, (normalize ? "and normalizing." : "."));

    if (cmd_ln_str("-mixws")) {
	mixw_s = cmd_ln_int32("-mixws");
    }
    if (cmd_ln_str("-mixwe")) {
	mixw_e = cmd_ln_int32("-mixwe");
    }
    if (mixw_s == NO_ID && mixw_e == NO_ID) {
	if (s3mixw_read(fn,
			&mixw,
			&n_mixw,
			&n_feat,
			&n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u\n", n_mixw, n_feat, n_density);
    }
    else {
	if (s3mixw_intv_read(fn,
			     mixw_s,
			     mixw_e,
			     &mixw,
			     &n_mixw,
			     &n_feat,
			     &n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u subinterval [%u %u]\n",
	       n_mixw, n_feat, n_density, mixw_s, mixw_e);
    }


    for (i = 0; i < n_mixw; i++) {
	if (mixw_s != NO_ID)
	    p_i = i + mixw_s;
	else
	    p_i = i;

	for (j = 0; j < n_feat; j++) {
	    for (k = 0, sum = 0; k < n_density; k++) {
		sum += mixw[i][j][k];
	    }
		
	    printf("mixw [%u %u] %e\n", p_i, j, sum);

	    if (normalize) {
		if (sum == 0) {
		    E_WARN("mixw [%u][%u][*] zero\n", p_i, j);
		    sum = 1;
		}
	    }
	    else
		sum = 1;

	    for (k = 0; k < n_density; k++) {
		if ((k % 8) == 0)
		    printf("\n\t");
		printf(e_fmt, mixw[i][j][k]/sum);
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}